

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O2

pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> * __thiscall
PhyloTree::leaf_difference
          (pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
           *__return_storage_ptr__,PhyloTree *this,PhyloTree *other)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  __type_conflict _Var5;
  ulong uVar6;
  pointer __rhs;
  ulong uVar7;
  pointer __lhs;
  bool bVar8;
  int local_94;
  pointer local_90;
  pointer local_88;
  pointer local_80;
  pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> local_78;
  pointer local_40;
  pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *local_38;
  
  local_78.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  bVar3 = std::operator==(&this->leaf2NumMap,&other->leaf2NumMap);
  if (bVar3) {
    (__return_storage_ptr__->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0012b42e:
    local_78.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_78.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_78.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_78.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_78.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_78.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>::
    ~pair(&local_78);
    return __return_storage_ptr__;
  }
  pbVar1 = (this->leaf2NumMap).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_80 = (this->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  __rhs = (other->leaf2NumMap).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_88 = (other->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  uVar7 = 0;
  __lhs = pbVar1;
  local_90 = __rhs;
  local_40 = pbVar1;
  local_38 = __return_storage_ptr__;
LAB_0012b2e3:
  uVar6 = (long)__lhs - (long)pbVar1;
  do {
    bVar3 = __rhs == local_88;
    bVar8 = __lhs == local_80;
LAB_0012b2fb:
    pbVar2 = local_88;
    if (bVar8 || bVar3) {
      for (; __return_storage_ptr__ = local_38, pbVar1 = local_90, __lhs != local_80;
          __lhs = __lhs + 1) {
        local_94 = (int)(uVar6 >> 5);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&local_78.first,&local_94);
        uVar6 = uVar6 + 0x20;
      }
      for (; (pointer)((long)&(pbVar1->_M_dataplus)._M_p + uVar7) != pbVar2; uVar7 = uVar7 + 0x20) {
        local_94 = (int)(uVar7 >> 5);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&local_78.second,&local_94);
      }
      (__return_storage_ptr__->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_78.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_78.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_78.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_78.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_78.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_78.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      goto LAB_0012b42e;
    }
    bVar4 = std::operator<(__lhs,__rhs);
    if (!bVar4) {
      _Var5 = std::operator==(__lhs,__rhs);
      if (!_Var5) break;
      __lhs = __lhs + 1;
      goto LAB_0012b381;
    }
    local_94 = (int)((ulong)((long)__lhs - (long)local_40) >> 5);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&local_78.first,&local_94);
    __lhs = __lhs + 1;
    uVar6 = uVar6 + 0x20;
  } while( true );
  bVar4 = std::operator<(__rhs,__lhs);
  if (bVar4) {
    local_94 = (int)((ulong)((long)__rhs - (long)local_90) >> 5);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&local_78.second,&local_94);
LAB_0012b381:
    __rhs = __rhs + 1;
    uVar7 = uVar7 + 0x20;
    goto LAB_0012b2e3;
  }
  goto LAB_0012b2fb;
}

Assistant:

std::pair<std::vector<int>, std::vector<int>> PhyloTree::leaf_difference(const PhyloTree& other) {
    std::pair<std::vector<int>, std::vector<int>> out;
    if (this->leaf2NumMap == other.leaf2NumMap) {
        return std::move(out);
    }

    auto beg1 = this->leaf2NumMap.begin();
    auto beg2 = other.leaf2NumMap.begin();
    auto end1 = this->leaf2NumMap.end();
    auto end2 = other.leaf2NumMap.end();
    auto o1 = std::back_inserter(out.first);
    auto o2 = std::back_inserter(out.second);
    auto front1 = beg1;
    auto front2 = beg2;

    while (beg1 != end1 && beg2 != end2) {
        if ((*beg1) < (*beg2)) {
            (*o1++) = std::distance(front1, beg1++);
        }
        else if ((*beg1) == (*beg2)) {
            beg1++;
            beg2++;
        }
        else if ((*beg2) < (*beg1)) {
            (*o2++) = std::distance(front2, beg2++);
        }
    }

    while (beg1 != end1) {
        (*o1++) = std::distance(front1, beg1++);
    }

    while (beg2 != end2) {
        (*o2++) = std::distance(front2, beg2++);
    }
    return std::move(out);
}